

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::set_peer_classes
          (session_impl *this,peer_class_set *s,address *a,socket_type_t st)

{
  value_type *pvVar1;
  peer_class *ppVar2;
  peer_class_t local_30;
  socket_type_t local_29;
  peer_class_t i;
  sock_t socket_type;
  uint32_t peer_class_mask;
  socket_type_t st_local;
  address *a_local;
  peer_class_set *s_local;
  session_impl *this_local;
  
  i.m_val = ip_filter::access(&this->m_peer_class_filter,(char *)a,(int)a);
  pvVar1 = container_wrapper<libtorrent::peer_class_type_filter::socket_type_t,_libtorrent::socket_type_t,_std::array<libtorrent::peer_class_type_filter::socket_type_t,_10UL>_>
           ::operator[](&set_peer_classes::mapping,st);
  local_29 = *pvVar1;
  i.m_val = peer_class_type_filter::apply(&this->m_peer_class_type_filter,local_29,i.m_val);
  memset(&local_30,0,4);
  while (i.m_val != 0) {
    if (((i.m_val & 1) != 0) &&
       (ppVar2 = peer_class_pool::at(&this->m_classes,local_30), ppVar2 != (peer_class *)0x0)) {
      peer_class_set::add_class(s,&this->m_classes,local_30);
    }
    i.m_val = i.m_val >> 1;
    strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>::operator++(&local_30);
  }
  return;
}

Assistant:

void session_impl::set_peer_classes(peer_class_set* s, address const& a, socket_type_t const st)
	{
		std::uint32_t peer_class_mask = m_peer_class_filter.access(a);

		using sock_t = peer_class_type_filter::socket_type_t;
		// assign peer class based on socket type
		static aux::array<sock_t, 10, socket_type_t> const mapping{{{
			sock_t::tcp_socket
			, sock_t::tcp_socket
			, sock_t::tcp_socket
			, sock_t::utp_socket
			, sock_t::i2p_socket
			, sock_t::rtc_socket
			, sock_t::ssl_tcp_socket
			, sock_t::ssl_tcp_socket
			, sock_t::ssl_tcp_socket
			, sock_t::ssl_utp_socket
		}}};
		sock_t const socket_type = mapping[st];
		// filter peer classes based on type
		peer_class_mask = m_peer_class_type_filter.apply(socket_type, peer_class_mask);

		for (peer_class_t i{0}; peer_class_mask; peer_class_mask >>= 1, ++i)
		{
			if ((peer_class_mask & 1) == 0) continue;

			// if you hit this assert, your peer class filter contains
			// a bitmask referencing a non-existent peer class
			TORRENT_ASSERT_PRECOND(m_classes.at(i));

			if (m_classes.at(i) == nullptr) continue;
			s->add_class(m_classes, i);
		}
	}